

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall deqp::gls::MemObjectAllocator::allocateBuffer(MemObjectAllocator *this,Random *rnd)

{
  int size_00;
  GLenum GVar1;
  size_type sVar2;
  reference pvVar3;
  Error *err;
  OutOfMemoryError *anon_var_0;
  int size;
  deUint32 error;
  deUint32 buffer;
  int vectorBlockSize;
  Random *rnd_local;
  MemObjectAllocator *this_local;
  
  error = 0x80;
  size = 0;
  _buffer = rnd;
  rnd_local = (Random *)this;
  size_00 = de::Random::getInt(rnd,(this->m_config).minBufferSize,(this->m_config).maxBufferSize);
  glwGenBuffers(1,(GLuint *)&size);
  GVar1 = glwGetError();
  if (GVar1 == 0) {
    glwBindBuffer(0x8892,size);
    GVar1 = glwGetError();
    if (GVar1 == 0) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
      if ((sVar2 & 0x7f) == 0) {
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&this->m_buffers,sVar2 + 0x80);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_buffers,(value_type_conflict4 *)&size);
      if (((this->m_config).useDummyData & 1U) == 0) {
        glwBufferData(0x8892,(long)size_00,(void *)0x0,0x88e8);
      }
      else {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_dummyData,0);
        glwBufferData(0x8892,(long)size_00,pvVar3,0x88e8);
      }
      GVar1 = glwGetError();
      if (GVar1 == 0) {
        if (((this->m_config).write & 1U) != 0) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->m_dummyData,0);
          glwBufferSubData(0x8892,0,1,pvVar3);
        }
        GVar1 = glwGetError();
        if (GVar1 == 0) {
          if (((this->m_config).use & 1U) != 0) {
            BufferRenderer::render(&this->m_bufferRenderer,size,size_00);
          }
          glwBindBuffer(0x8892,0);
          GVar1 = glwGetError();
          if (GVar1 == 0) {
            this->m_objectCount = this->m_objectCount + 1;
            this->m_bytesRequired = size_00 + this->m_bytesRequired;
          }
          else {
            this->m_result = RESULT_BIND_BUFFER_FAILED;
            this->m_glError = GVar1;
          }
        }
        else {
          this->m_result = RESULT_BUFFER_SUB_DATA_FAILED;
          this->m_glError = GVar1;
        }
      }
      else {
        this->m_result = RESULT_BUFFER_DATA_FAILED;
        this->m_glError = GVar1;
      }
    }
    else {
      this->m_result = RESULT_BIND_BUFFER_FAILED;
      this->m_glError = GVar1;
    }
  }
  else {
    this->m_result = RESULT_GEN_BUFFERS_FAILED;
    this->m_glError = GVar1;
  }
  return;
}

Assistant:

void MemObjectAllocator::allocateBuffer (de::Random& rnd)
{
	const int	vectorBlockSize = 128;
	deUint32	buffer			= 0;
	deUint32	error			= 0;
	int			size			= rnd.getInt(m_config.minBufferSize, m_config.maxBufferSize);

	glGenBuffers(1, &buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_GEN_BUFFERS_FAILED;
		m_glError	= error;
		return;
	}

	glBindBuffer(GL_ARRAY_BUFFER, buffer);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	if (m_buffers.size() % vectorBlockSize == 0)
		m_buffers.reserve(m_buffers.size() + vectorBlockSize);

	m_buffers.push_back(buffer);

	if (m_config.useDummyData)
	{
		DE_ASSERT((int)m_dummyData.size() >= size);
		glBufferData(GL_ARRAY_BUFFER, size, &(m_dummyData[0]), GL_DYNAMIC_DRAW);
	}
	else
		glBufferData(GL_ARRAY_BUFFER, size, NULL, GL_DYNAMIC_DRAW);

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.write)
		glBufferSubData(GL_ARRAY_BUFFER, 0, 1, &(m_dummyData[0]));

	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BUFFER_SUB_DATA_FAILED;
		m_glError	= error;
		return;
	}

	if (m_config.use)
	{
		try
		{
			m_bufferRenderer.render(buffer, size);
		}
		catch (const glu::Error& err)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= err.getError();
			return;
		}
		catch (const glu::OutOfMemoryError&)
		{
			m_result	= RESULT_RENDER_FAILED;
			m_glError	= GL_OUT_OF_MEMORY;
			return;
		}
	}

	glBindBuffer(GL_ARRAY_BUFFER, 0);
	error = glGetError();
	if (error != 0)
	{
		m_result	= RESULT_BIND_BUFFER_FAILED;
		m_glError	= error;
		return;
	}

	m_objectCount++;
	m_bytesRequired += size;
}